

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void absl::lts_20250127::base_internal::LLA_SkiplistInsert
               (AllocList *head,AllocList *e,AllocList **prev)

{
  uint uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  
  LLA_SkiplistSearch(head,e,prev);
  lVar2 = (long)head->levels;
  while (uVar1 = e->levels, (int)lVar2 < (int)uVar1) {
    prev[lVar2] = head;
    lVar2 = lVar2 + 1;
    head->levels = (int)lVar2;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    e->next[uVar3] = prev[uVar3]->next[uVar3];
    prev[uVar3]->next[uVar3] = e;
  }
  return;
}

Assistant:

static void LLA_SkiplistInsert(AllocList *head, AllocList *e,
                               AllocList **prev) {
  LLA_SkiplistSearch(head, e, prev);
  for (; head->levels < e->levels; head->levels++) {  // extend prev pointers
    prev[head->levels] = head;                        // to all *e's levels
  }
  for (int i = 0; i != e->levels; i++) {  // add element to list
    e->next[i] = prev[i]->next[i];
    prev[i]->next[i] = e;
  }
}